

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  World *this;
  Sphere *this_00;
  Parallelepiped *this_01;
  CornellBox *this_02;
  PointLight *pPVar1;
  Camera *this_03;
  ostream *poVar2;
  ColorRGB local_270;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_260;
  ColorRGB local_250;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_240;
  ColorRGB local_230;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_220;
  ColorRGB local_210;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_200;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1f0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1e0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1d0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1c0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1b0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_1a0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_190;
  ColorRGB local_180;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_170;
  mat4 model;
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 local_120 [4];
  tmat4x4<float> local_e0;
  tmat4x4<float> local_a0;
  tmat4x4<float> local_60;
  
  this = (World *)operator_new(0x38);
  World::World(this);
  this_00 = (Sphere *)operator_new(0xa8);
  glm::translate<float>(&model,6.0,-7.0,-50.0);
  ColorRGB::ColorRGB(&local_180,1.0,1.0,1.0);
  local_120[0].field_0.x = 3.0;
  Sphere::Sphere(this_00,&model,local_180,(float *)local_120);
  World::addSceneObject(this,(SceneObject *)this_00);
  glm::translate<float>(&local_60,-4.0,-10.0,-55.0);
  local_170._0_8_ = 0x3f80000000000000;
  local_170.field_0.z = 0.0;
  glm::rotate<float>(&local_a0,40.0,(tvec3<float> *)&local_170.field_0);
  glm::detail::operator*(&local_60,&local_a0);
  glm::scale<float>(&local_e0,10.0,12.0,8.0);
  glm::detail::operator*((tmat4x4<float> *)&local_120[0].field_0,&local_e0);
  this_01 = (Parallelepiped *)operator_new(0x120);
  local_190._0_8_ = 0;
  local_190.field_0.z = 0.0;
  local_1a0._0_8_ = 0x3f800000;
  local_1a0.field_0.z = 0.0;
  local_1b0._0_8_ = 0x3f80000000000000;
  local_1b0.field_0.z = 0.0;
  local_1c0._0_8_ = 0x3f8000003f800000;
  local_1c0.field_0.z = 0.0;
  local_1d0._0_8_ = 0;
  local_1d0.field_0.z = -1.0;
  local_1e0._0_8_ = 0x3f800000;
  local_1e0.field_0.z = -1.0;
  local_1f0._0_8_ = 0x3f80000000000000;
  local_1f0.field_0.z = -1.0;
  local_200._0_8_ = 0x3f8000003f800000;
  local_200.field_0.z = -1.0;
  ColorRGB::ColorRGB(&local_210,1.0,1.0,0.0);
  Parallelepiped::Parallelepiped
            (this_01,&model,(vec3 *)&local_190.field_0,(vec3 *)&local_1a0.field_0,
             (vec3 *)&local_1b0.field_0,(vec3 *)&local_1c0.field_0,(vec3 *)&local_1d0.field_0,
             (vec3 *)&local_1e0.field_0,(vec3 *)&local_1f0.field_0,(vec3 *)&local_200.field_0,true,
             local_210);
  World::addSceneObject(this,(SceneObject *)this_01);
  this_02 = (CornellBox *)operator_new(0x148);
  CornellBox::CornellBox(this_02);
  World::addSceneObject(this,(SceneObject *)this_02);
  pPVar1 = (PointLight *)operator_new(0x18);
  local_220._0_8_ = 0x40c0000000000000;
  local_220.field_0.z = -40.0;
  ColorRGB::ColorRGB(&local_230,0.0,0.0,0.5);
  PointLight::PointLight(pPVar1,(vec3 *)&local_220.field_0,local_230);
  World::addPointLight(this,pPVar1);
  pPVar1 = (PointLight *)operator_new(0x18);
  local_240._0_8_ = 0xc0c00000c0a00000;
  local_240.field_0.z = -44.0;
  ColorRGB::ColorRGB(&local_250,0.5,0.0,0.0);
  PointLight::PointLight(pPVar1,(vec3 *)&local_240.field_0,local_250);
  World::addPointLight(this,pPVar1);
  pPVar1 = (PointLight *)operator_new(0x18);
  local_260._0_8_ = 0xc0c0000040800000;
  local_260.field_0.z = -40.0;
  ColorRGB::ColorRGB(&local_270,0.0,0.5,0.0);
  PointLight::PointLight(pPVar1,(vec3 *)&local_260.field_0,local_270);
  World::addPointLight(this,pPVar1);
  this_03 = (Camera *)operator_new(0x38);
  BoundingBox::intersects((BoundingBox *)this_03);
  Camera::raytraceToFile(this_03,this,"./test.ppm");
  poVar2 = std::operator<<((ostream *)&std::cout,"Done");
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int main()
{    
    World *world = new World();
    SceneObject *so;
    
//     so = new Sphere(glm::translate<float>(4.0, 0.0, -45.0), ColorRGB(1.0, 1.0, 1.0), 1.0);
//     world->addSceneObject(so);
    
    //some nice spheres
    so = new Sphere(glm::translate<float>(6.0, -7.0, -50.0), ColorRGB(1.0, 1.0, 1.0), 3.0);
    world->addSceneObject(so);
    
    glm::mat4 model =
        glm::translate<float>(-4.0, -10.0, -55.0) *
        glm::rotate<float>(40, glm::vec3(0, 1, 0)) *
        glm::scale<float>(10, 12, 8);
    
    so = new Parallelepiped(
        model,
        glm::vec3(0, 0, 0),
        glm::vec3(1, 0, 0),
        glm::vec3(0, 1, 0),
        glm::vec3(1, 1, 0),
        glm::vec3(0, 0, -1),
        glm::vec3(1, 0, -1),
        glm::vec3(0, 1, -1),
        glm::vec3(1, 1, -1),
        true,
        ColorRGB(1.0, 1.0, 0.0));
    world->addSceneObject(so);
    
//     so = new Parallelepiped(
//         glm::translate<float>(3.0, 0.0, -45.0),
//         glm::vec3(0, 0, 0),
//         glm::vec3(1, 0, 0),
//         glm::vec3(0, 1, 0),
//         glm::vec3(1, 1, 0),
//         glm::vec3(0, 0, -1),
//         glm::vec3(1, 0, -1),
//         glm::vec3(0, 1, -1),
//         glm::vec3(1, 1, -1),
//         true,
//         ColorRGB(1.0, 1.0, 1.0));
//     world->addSceneObject(so);
    
    so = new CornellBox();
    world->addSceneObject(so);
    
        
    world->addPointLight(new PointLight(glm::vec3(0, 6, -40), ColorRGB(0, 0, 0.5)));
    world->addPointLight(new PointLight(glm::vec3(-5, -6, -44), ColorRGB(0.5, 0, 0)));
    world->addPointLight(new PointLight(glm::vec3(4, -6, -40), ColorRGB(0, 0.5, 0)));
    
    Camera *cam = new Camera();
        
    cam->raytraceToFile(world, "./test.ppm");

    std::cout << "Done" << std::endl;
    return 0;
}